

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

int __thiscall QObjectPrivate::signalIndex(QObjectPrivate *this,char *signalName,QMetaObject **meta)

{
  QByteArrayView name_00;
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  QObject *pQVar5;
  undefined4 extraout_var;
  size_type sVar6;
  QArgumentType *pQVar7;
  undefined8 *in_RDX;
  QObjectPrivate *in_RDI;
  long in_FS_OFFSET;
  int relative_index;
  QObject *q;
  QByteArrayView name;
  QMetaObject *base;
  QArgumentTypeArray types;
  QArgumentType *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  int in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  char *in_stack_fffffffffffffe18;
  int local_18c;
  QVarLengthArray<QArgumentType,_10LL> local_160;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = q_func(in_RDI);
  iVar1 = (**pQVar5->_vptr_QObject)();
  memset(&local_160,0xaa,0x158);
  QVarLengthArray<QArgumentType,_10LL>::QVarLengthArray(&local_160);
  QMetaObjectPrivate::decodeMethodSignature
            (in_stack_fffffffffffffe18,
             (QArgumentTypeArray *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  sVar6 = QVLABaseBase::size((QVLABaseBase *)&local_160);
  uVar2 = (undefined4)sVar6;
  pQVar7 = QVarLengthArray<QArgumentType,_10LL>::constData
                     ((QVarLengthArray<QArgumentType,_10LL> *)0x3ead6f);
  name_00.m_size._4_4_ = uVar2;
  name_00.m_size._0_4_ = in_stack_fffffffffffffe10;
  name_00.m_data = (storage_type *)pQVar7;
  iVar3 = QMetaObjectPrivate::indexOfSignalRelative
                    ((QMetaObject **)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                     name_00,in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8);
  local_18c = iVar3;
  if (-1 < iVar3) {
    iVar4 = QMetaObjectPrivate::originalClone((QMetaObject *)in_stack_fffffffffffffde8,0);
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = CONCAT44(extraout_var,iVar1);
    }
    in_stack_fffffffffffffe00 = iVar4;
    iVar1 = QMetaObjectPrivate::signalOffset
                      ((QMetaObject *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0))
    ;
    local_18c = iVar4 + iVar1;
  }
  QVarLengthArray<QArgumentType,_10LL>::~QVarLengthArray
            ((QVarLengthArray<QArgumentType,_10LL> *)CONCAT44(iVar3,in_stack_fffffffffffffe00));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_18c;
}

Assistant:

int QObjectPrivate::signalIndex(const char *signalName,
                                const QMetaObject **meta) const
{
    Q_Q(const QObject);
    const QMetaObject *base = q->metaObject();
    Q_ASSERT(QMetaObjectPrivate::get(base)->revision >= 7);
    QArgumentTypeArray types;
    QByteArrayView name = QMetaObjectPrivate::decodeMethodSignature(signalName, types);
    int relative_index = QMetaObjectPrivate::indexOfSignalRelative(
            &base, name, types.size(), types.constData());
    if (relative_index < 0)
        return relative_index;
    relative_index = QMetaObjectPrivate::originalClone(base, relative_index);
    if (meta)
        *meta = base;
    return relative_index + QMetaObjectPrivate::signalOffset(base);
}